

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

void * FileSystem::ReadFileRawToEnd(string *file)

{
  pointer pcVar1;
  int iVar2;
  void *__ptr;
  FILE *__stream;
  size_t sVar3;
  size_t __size;
  stat sts;
  char *local_d0 [2];
  char local_c0 [16];
  stat local_b0;
  
  pcVar1 = (file->_M_dataplus)._M_p;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar1,pcVar1 + file->_M_string_length);
  iVar2 = stat(local_d0[0],&local_b0);
  __size = local_b0.st_size;
  if (iVar2 + 1U < 2) {
    __size = 0;
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  if ((__size != 0) && (__ptr = malloc(__size), __ptr != (void *)0x0)) {
    __stream = fopen((file->_M_dataplus)._M_p,"r");
    if (__stream != (FILE *)0x0) {
      sVar3 = fread(__ptr,1,__size,__stream);
      fclose(__stream);
      if (sVar3 == __size) {
        return __ptr;
      }
    }
    free(__ptr);
  }
  return (void *)0x0;
}

Assistant:

void* FileSystem::ReadFileRawToEnd(string file) {
    off_t fileSize = GetFileSize(file);

    if(fileSize == 0)
        return NULL;

    void* allocatedBuffer = malloc((size_t) fileSize);

    if(allocatedBuffer == NULL)
        return NULL;

    FILE* fp = fopen(file.c_str(), "r");

    if(fp) {
        size_t readSize = fread(allocatedBuffer, 1, (size_t) fileSize, fp);

        fclose(fp);

        if(readSize == fileSize) {
            return allocatedBuffer;
        }
    }

    free(allocatedBuffer);

    return NULL;
}